

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fast_float.h
# Opt level: O2

from_chars_result
duckdb_fast_float::from_chars<float>
          (char *first,char *last,float *value,bool strict,char decimal_separator,chars_format fmt)

{
  char cVar1;
  byte bVar2;
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  from_chars_result fVar13;
  from_chars_result fVar14;
  from_chars_result fVar15;
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  bool bVar18;
  uint uVar19;
  int iVar20;
  int iVar21;
  uint uVar22;
  uint uVar23;
  long lVar24;
  ulong uVar25;
  long lVar26;
  int iVar27;
  uint uVar28;
  byte *pbVar29;
  ulong uVar30;
  ulong uVar31;
  float fVar32;
  ulong uVar33;
  byte *pbVar34;
  byte *pbVar35;
  byte *pbVar36;
  byte *pbVar37;
  byte *pbVar38;
  long lVar39;
  float fVar40;
  from_chars_result fVar41;
  adjusted_mantissa aVar42;
  
  if (first == last) {
    fVar41._8_8_ = 0x16;
    fVar41.ptr = first;
    return fVar41;
  }
  cVar1 = *first;
  pbVar29 = (byte *)first;
  if ((cVar1 == '-') &&
     ((pbVar29 = (byte *)(first + 1), pbVar29 == (byte *)last ||
      (*pbVar29 != decimal_separator && 9 < (byte)(*pbVar29 - 0x30))))) goto LAB_01276498;
  uVar31 = 0;
  pbVar37 = pbVar29;
  while( true ) {
    pbVar36 = pbVar37;
    if (pbVar36 == (byte *)last) {
      lVar24 = (long)last - (long)pbVar29;
      pbVar37 = (byte *)0x0;
      pbVar35 = (byte *)last;
      goto LAB_012763b8;
    }
    bVar2 = *pbVar36;
    if (9 < (byte)(bVar2 - 0x30)) break;
    uVar31 = (uVar31 * 10 + (ulong)bVar2) - 0x30;
    pbVar37 = pbVar36 + 1;
    if (((pbVar37 != (byte *)last) && (*pbVar37 == 0x5f)) &&
       ((strict ||
        ((pbVar37 = pbVar36 + 2, pbVar37 == (byte *)last || (9 < (byte)(*pbVar37 - 0x30)))))))
    goto LAB_01276498;
  }
  lVar24 = (long)pbVar36 - (long)pbVar29;
  pbVar35 = pbVar36;
  if (bVar2 == decimal_separator) {
    pbVar37 = pbVar36 + 1;
    pbVar38 = pbVar36 + 9;
    pbVar34 = pbVar37;
    if ((pbVar38 <= last) &&
       (uVar33 = *(long *)pbVar37 + 0xcfcfcfcfcfcfcfd0,
       ((*(long *)pbVar37 + 0x4646464646464646U | uVar33) & 0x8080808080808080) == 0)) {
      uVar33 = (uVar33 >> 8) + uVar33 * 10;
      uVar31 = ((uVar33 >> 0x10 & 0xff000000ff) * 0x271000000001 +
                (uVar33 & 0xff000000ff) * 0xf424000000064 >> 0x20) + uVar31 * 100000000;
      pbVar34 = pbVar38;
      if ((pbVar36 + 0x11 <= last) &&
         (uVar33 = *(long *)pbVar38 + 0xcfcfcfcfcfcfcfd0,
         ((*(long *)pbVar38 + 0x4646464646464646U | uVar33) & 0x8080808080808080) == 0)) {
        uVar33 = (uVar33 >> 8) + uVar33 * 10;
        uVar31 = ((uVar33 >> 0x10 & 0xff000000ff) * 0x271000000001 +
                  (uVar33 & 0xff000000ff) * 0xf424000000064 >> 0x20) + uVar31 * 100000000;
        pbVar34 = pbVar36 + 0x11;
      }
    }
    lVar39 = 0;
    do {
      pbVar34 = pbVar34 + 2;
      while( true ) {
        pbVar38 = pbVar34 + -2;
        pbVar36 = (byte *)last;
        if ((pbVar38 == (byte *)last) || (pbVar36 = pbVar38, 9 < (byte)(*pbVar38 - 0x30))) {
          pbVar37 = pbVar37 + (lVar39 - (long)pbVar36);
          lVar24 = lVar24 - (long)pbVar37;
          goto LAB_012763b8;
        }
        uVar31 = (ulong)(byte)(*pbVar38 - 0x30) + uVar31 * 10;
        if ((pbVar34 + -1 != (byte *)last) && (pbVar34[-1] == 0x5f)) break;
        pbVar34 = pbVar34 + 1;
      }
    } while ((!strict) &&
            ((pbVar34 != (byte *)last && (lVar39 = lVar39 + 1, (byte)(*pbVar34 - 0x30) < 10))));
    goto LAB_01276498;
  }
  pbVar37 = (byte *)0x0;
LAB_012763b8:
  if (lVar24 == 0) goto LAB_01276498;
  if ((((fmt & scientific) == 0) || (pbVar36 == (byte *)last)) || ((*pbVar36 | 0x20) != 0x65)) {
    if ((fmt & general) == scientific) goto LAB_01276498;
  }
  else {
    pbVar38 = pbVar36 + 1;
    if (pbVar38 == (byte *)last) {
LAB_01276413:
      bVar18 = false;
    }
    else {
      if (*pbVar38 != 0x2d) {
        if (*pbVar38 == 0x2b) {
          pbVar38 = pbVar36 + 2;
        }
        goto LAB_01276413;
      }
      pbVar38 = pbVar36 + 2;
      bVar18 = true;
    }
    if ((pbVar38 != (byte *)last) && ((byte)(*pbVar38 - 0x30) < 10)) {
      lVar26 = 0;
      do {
        pbVar36 = pbVar38;
        if ((pbVar36 == (byte *)last) || (9 < (byte)(*pbVar36 - 0x30))) {
          lVar39 = -lVar26;
          if (!bVar18) {
            lVar39 = lVar26;
          }
          pbVar37 = pbVar37 + lVar39;
          goto LAB_012764ba;
        }
        lVar39 = (ulong)(byte)(*pbVar36 - 0x30) + lVar26 * 10;
        if (0xffff < lVar26) {
          lVar39 = lVar26;
        }
        lVar26 = lVar39;
        pbVar38 = pbVar36 + 1;
      } while (((pbVar38 == (byte *)last) || (*pbVar38 != 0x5f)) ||
              ((!strict &&
               ((pbVar38 = pbVar36 + 2, pbVar38 != (byte *)last && ((byte)(*pbVar38 - 0x30) < 10))))
              ));
      goto LAB_01276498;
    }
    if ((fmt & fixed) == 0) goto LAB_01276498;
  }
  lVar39 = 0;
LAB_012764ba:
  pbVar38 = pbVar29;
  if (0x13 < lVar24) {
    for (; (pbVar38 != (byte *)last &&
           (bVar2 = *pbVar38, bVar2 == 0x30 || bVar2 == decimal_separator)); pbVar38 = pbVar38 + 1)
    {
      lVar24 = lVar24 - (ulong)(bVar2 == 0x30);
    }
    if (0x13 < lVar24) {
      uVar31 = 0;
      do {
        pbVar38 = pbVar29;
        if ((999999999999999999 < uVar31) || (pbVar38 == (byte *)last)) {
          if (uVar31 < 1000000000000000000) {
LAB_012768b6:
            pbVar29 = pbVar38 + lVar39;
            pbVar38 = pbVar38 + 1;
            do {
              pbVar29 = pbVar29 + 1;
              pbVar37 = pbVar29 + -(long)pbVar38;
              pbVar38 = pbVar38 + 2;
              while( true ) {
                bVar18 = true;
                if (((999999999999999999 < uVar31) || (pbVar38 + -2 == (byte *)last)) ||
                   (bVar2 = pbVar38[-2], 9 < (byte)(bVar2 - 0x30))) goto LAB_0127656f;
                uVar31 = (uVar31 * 10 + (ulong)bVar2) - 0x30;
                if ((pbVar38 + -1 != (byte *)last) && (pbVar38[-1] == 0x5f)) break;
                pbVar37 = pbVar37 + -1;
                pbVar38 = pbVar38 + 1;
              }
            } while ((pbVar38 != (byte *)last) && ((byte)(*pbVar38 - 0x30) < 10));
            break;
          }
          pbVar37 = pbVar35 + (lVar39 - (long)pbVar38);
          bVar18 = true;
          goto LAB_0127656f;
        }
        if (9 < (byte)(*pbVar38 - 0x30)) goto LAB_012768b6;
        uVar31 = (uVar31 * 10 + (ulong)*pbVar38) - 0x30;
        pbVar29 = pbVar38 + 1;
      } while (((pbVar29 == (byte *)last) || (*pbVar29 != 0x5f)) ||
              ((!strict &&
               ((pbVar29 = pbVar38 + 2, pbVar29 != (byte *)last && ((byte)(*pbVar29 - 0x30) < 10))))
              ));
LAB_01276498:
      fVar41 = detail::parse_infnan<float>(first,last,value);
      return fVar41;
    }
  }
  bVar18 = false;
LAB_0127656f:
  iVar20 = (int)pbVar37;
  if (pbVar37 + -0xb < (byte *)0xffffffffffffffeb) {
LAB_0127657d:
    if (uVar31 == 0) {
      uVar31 = 0;
LAB_01276655:
      uVar28 = 0;
    }
    else {
      if ((long)pbVar37 < -0x41) goto LAB_01276655;
      if ((long)pbVar37 < 0x27) goto LAB_012765aa;
      uVar28 = 0xff;
    }
    uVar19 = 0;
LAB_0127665b:
    if (!bVar18) goto LAB_012766a2;
LAB_01276660:
    uVar31 = uVar31 + 1;
    uVar22 = 0;
    if ((long)pbVar37 < -0x41) {
LAB_01276686:
      uVar23 = 0;
    }
    else {
      uVar23 = 0;
      uVar22 = 0;
      if (uVar31 != 0) {
        if (0x26 < (long)pbVar37) {
          uVar22 = 0xff;
          goto LAB_01276686;
        }
        uVar33 = 0x3f;
        if (uVar31 != 0) {
          for (; uVar31 >> uVar33 == 0; uVar33 = uVar33 - 1) {
          }
        }
        uVar31 = uVar31 << ((byte)(uVar33 ^ 0x3f) & 0x3f);
        auVar5._8_8_ = 0;
        auVar5._0_8_ = uVar31;
        auVar9._8_8_ = 0;
        auVar9._0_8_ = *(ulong *)(powers_template<void>::power_of_five_128 +
                                 (long)(iVar20 * 2 + 0x2ac) * 8);
        auVar12 = auVar5 * auVar9;
        uVar25 = auVar12._8_8_;
        if ((~uVar25 & 0x3fffffffff) == 0) {
          auVar6._8_8_ = 0;
          auVar6._0_8_ = uVar31;
          auVar10._8_8_ = 0;
          auVar10._0_8_ =
               *(ulong *)(powers_template<void>::power_of_five_128 + (long)(iVar20 * 2 + 0x2ad) * 8)
          ;
          uVar31 = SUB168(auVar6 * auVar10,8);
          auVar17._8_8_ = 0;
          auVar17._0_8_ = uVar31;
          auVar17 = auVar12 + auVar17;
          auVar12._8_8_ = uVar31;
          auVar12._0_8_ = auVar17._0_8_;
          uVar25 = auVar17._8_8_;
        }
        if ((pbVar37 + 0x1b < (byte *)0x53) || (auVar12._0_8_ != 0xffffffffffffffff)) {
          iVar20 = ((iVar20 * 0x3526a >> 0x10) - (int)(uVar33 ^ 0x3f)) - (int)((long)uVar25 >> 0x3f)
          ;
          iVar21 = iVar20 + 0xbe;
          bVar2 = (byte)(uVar25 >> 0x3f);
          uVar31 = uVar25 >> (bVar2 | 0x26);
          if (iVar21 < 1) {
            uVar22 = 1 - iVar21;
            if (0x3f < uVar22) {
              uVar22 = 0;
              goto LAB_01276686;
            }
            uVar31 = (uVar31 >> ((byte)uVar22 & 0x3f)) +
                     (ulong)((uVar31 >> ((ulong)uVar22 & 0x3f) & 1) != 0);
            uVar23 = (uint)(uVar31 >> 1) & 0x7fffffff;
            uVar22 = (uint)(0xffffff < uVar31);
          }
          else {
            uVar33 = (ulong)((uint)uVar31 & 0x3fffffe);
            if (uVar31 << (bVar2 | 0x26) != uVar25 || ((uint)uVar31 & 3) != 1) {
              uVar33 = uVar31;
            }
            if (1 < auVar12._0_8_) {
              uVar33 = uVar31;
            }
            if ((byte *)0x1b < pbVar37 + 0x11) {
              uVar33 = uVar31;
            }
            uVar33 = ((uint)uVar33 & 1) + uVar33;
            uVar22 = (iVar20 + 0xbf) - (uint)(uVar33 < 0x2000000);
            uVar23 = (uint)(uVar33 >> 1) & 0x37fffff;
            if (0x1ffffff < uVar33) {
              uVar23 = 0;
            }
            if (0xfe < uVar22) {
              uVar23 = 0;
              uVar22 = 0xff;
            }
          }
        }
        else {
          uVar23 = 0;
          uVar22 = 0xffffffff;
        }
      }
    }
    if (((uVar19 == uVar23) && (-1 < (int)uVar28)) && (uVar28 == uVar22)) goto LAB_012766a2;
  }
  else {
    if (uVar31 < 0x1000001) {
      if (!bVar18) {
        if ((long)pbVar37 < 0) {
          fVar40 = (float)(long)uVar31 / *(float *)(powers_of_ten_float + (long)pbVar37 * -4);
        }
        else {
          fVar40 = (float)(long)uVar31 * *(float *)(powers_of_ten_float + (long)pbVar37 * 4);
        }
        fVar15._8_8_ = 0;
        fVar15.ptr = (char *)pbVar36;
        fVar14._8_8_ = 0;
        fVar14.ptr = (char *)pbVar36;
        *value = fVar40;
        if (cVar1 != '-') {
          return fVar14;
        }
        *value = -fVar40;
        return fVar15;
      }
      goto LAB_0127657d;
    }
LAB_012765aa:
    uVar33 = 0x3f;
    if (uVar31 != 0) {
      for (; uVar31 >> uVar33 == 0; uVar33 = uVar33 - 1) {
      }
    }
    uVar30 = uVar31 << ((byte)(uVar33 ^ 0x3f) & 0x3f);
    auVar3._8_8_ = 0;
    auVar3._0_8_ = uVar30;
    auVar7._8_8_ = 0;
    auVar7._0_8_ = *(ulong *)(powers_template<void>::power_of_five_128 +
                             (long)(iVar20 * 2 + 0x2ac) * 8);
    auVar11 = auVar3 * auVar7;
    uVar25 = auVar11._8_8_;
    if ((~uVar25 & 0x3fffffffff) == 0) {
      auVar4._8_8_ = 0;
      auVar4._0_8_ = uVar30;
      auVar8._8_8_ = 0;
      auVar8._0_8_ = *(ulong *)(powers_template<void>::power_of_five_128 +
                               (long)(iVar20 * 2 + 0x2ad) * 8);
      uVar25 = SUB168(auVar4 * auVar8,8);
      auVar16._8_8_ = 0;
      auVar16._0_8_ = uVar25;
      auVar16 = auVar11 + auVar16;
      auVar11._8_8_ = uVar25;
      auVar11._0_8_ = auVar16._0_8_;
      uVar25 = auVar16._8_8_;
    }
    if ((pbVar37 + 0x1b < (byte *)0x53) || (auVar11._0_8_ != 0xffffffffffffffff)) {
      iVar21 = ((iVar20 * 0x3526a >> 0x10) - (int)(uVar33 ^ 0x3f)) - (int)((long)uVar25 >> 0x3f);
      iVar27 = iVar21 + 0xbe;
      bVar2 = (byte)(uVar25 >> 0x3f);
      uVar33 = uVar25 >> (bVar2 | 0x26);
      if (iVar27 < 1) {
        uVar28 = 1 - iVar27;
        if (0x3f < uVar28) goto LAB_01276655;
        uVar33 = (uVar33 >> ((byte)uVar28 & 0x3f)) +
                 (ulong)((uVar33 >> ((ulong)uVar28 & 0x3f) & 1) != 0);
        uVar28 = (uint)(0xffffff < uVar33);
        uVar19 = (uint)(uVar33 >> 1) & 0x7fffffff;
      }
      else {
        uVar30 = (ulong)((uint)uVar33 & 0x3fffffe);
        if (uVar33 << (bVar2 | 0x26) != uVar25 || ((uint)uVar33 & 3) != 1) {
          uVar30 = uVar33;
        }
        if (1 < auVar11._0_8_) {
          uVar30 = uVar33;
        }
        if ((byte *)0x1b < pbVar37 + 0x11) {
          uVar30 = uVar33;
        }
        uVar30 = ((uint)uVar30 & 1) + uVar30;
        uVar28 = (iVar21 + 0xbf) - (uint)(uVar30 < 0x2000000);
        uVar19 = (uint)(uVar30 >> 1) & 0x37fffff;
        if (0x1ffffff < uVar30) {
          uVar19 = 0;
        }
        if (0xfe < uVar28) {
          uVar28 = 0xff;
          uVar19 = 0;
        }
      }
      goto LAB_0127665b;
    }
    if (bVar18) {
      uVar28 = 0xffffffff;
      uVar19 = 0;
      goto LAB_01276660;
    }
  }
  aVar42 = parse_long_mantissa<duckdb_fast_float::binary_format<float>>(first,last);
  uVar19 = (uint)aVar42.mantissa;
  uVar28 = aVar42.power2;
LAB_012766a2:
  fVar32 = (float)(uVar19 | uVar28 << 0x17);
  fVar40 = (float)((uint)fVar32 | 0x80000000);
  if (cVar1 != '-') {
    fVar40 = fVar32;
  }
  *value = fVar40;
  fVar13._8_8_ = 0;
  fVar13.ptr = (char *)pbVar36;
  return fVar13;
}

Assistant:

from_chars_result from_chars(const char *first, const char *last,
                             T &value, bool strict, const char decimal_separator, chars_format fmt
                              /*= chars_format::general*/)  noexcept  {
  static_assert (std::is_same<T, double>::value || std::is_same<T, float>::value, "only float and double are supported");


  from_chars_result answer;
  if (first == last) {
    answer.ec = std::errc::invalid_argument;
    answer.ptr = first;
    return answer;
  }
  parsed_number_string pns = parse_number_string(first, last, decimal_separator, fmt, strict);
  if (!pns.valid) {
    return detail::parse_infnan(first, last, value);
  }
  answer.ec = std::errc(); // be optimistic
  answer.ptr = pns.lastmatch;
  // Next is Clinger's fast path.
  if (binary_format<T>::min_exponent_fast_path() <= pns.exponent && pns.exponent <= binary_format<T>::max_exponent_fast_path() && pns.mantissa <=binary_format<T>::max_mantissa_fast_path() && !pns.too_many_digits) {
    value = T(pns.mantissa);
    if (pns.exponent < 0) { value = value / binary_format<T>::exact_power_of_ten(-pns.exponent); }
    else { value = value * binary_format<T>::exact_power_of_ten(pns.exponent); }
    if (pns.negative) { value = -value; }
    return answer;
  }
  adjusted_mantissa am = compute_float<binary_format<T>>(pns.exponent, pns.mantissa);
  if(pns.too_many_digits) {
    if(am != compute_float<binary_format<T>>(pns.exponent, pns.mantissa + 1)) {
      am.power2 = -1; // value is invalid.
    }
  }
  // If we called compute_float<binary_format<T>>(pns.exponent, pns.mantissa) and we have an invalid power (am.power2 < 0),
  // then we need to go the long way around again. This is very uncommon.
  if(am.power2 < 0) { am = parse_long_mantissa<binary_format<T>>(first,last); }
  detail::to_float(pns.negative, am, value);
  return answer;
}